

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_buffer.cpp
# Opt level: O0

bool dxil_spv::raw_access_byte_address_can_vectorize
               (Impl *impl,Type *type,Value *byte_offset,uint vecsize)

{
  undefined1 local_48 [8];
  RawBufferAccessSplit split;
  uint addr_shift_log2;
  uint vecsize_local;
  Value *byte_offset_local;
  Type *type_local;
  Impl *impl_local;
  
  if (((((impl->options).scalar_block_layout & 1U) == 0) ||
      (((impl->options).supports_per_component_robustness & 1U) == 0)) && (vecsize == 3)) {
    impl_local._7_1_ = false;
  }
  else if (((impl->options).ssbo_alignment < 0x11) || (vecsize != 3)) {
    split.dynamic_index._4_4_ = vecsize;
    split.dynamic_index._0_4_ = raw_buffer_data_type_to_addr_shift_log2(impl,type);
    memset(local_48,0,0x18);
    impl_local._7_1_ =
         extract_raw_buffer_access_split
                   (byte_offset,1,(uint)split.dynamic_index,split.dynamic_index._4_4_,
                    (RawBufferAccessSplit *)local_48);
  }
  else {
    impl_local._7_1_ = false;
  }
  return impl_local._7_1_;
}

Assistant:

bool raw_access_byte_address_can_vectorize(Converter::Impl &impl, const llvm::Type *type,
                                           const llvm::Value *byte_offset,
                                           unsigned vecsize)
{
	// vec3 vectorization requires scalar block layout always.
	// For byte address buffers, robustness must be checked per component, and a vectorized vec3 load
	// can straddle the boundary. If the hardware is known not to support per-component robustness correctly,
	// avoid vectorizing this case.
	if ((!impl.options.scalar_block_layout || !impl.options.supports_per_component_robustness) && vecsize == 3)
		return false;

	if (impl.options.ssbo_alignment > 16 && vecsize == 3)
		return false;

	// The rules for raw BAB vectorization are pretty simple.
	// If the offset % element_size == 0, we can translate that load to a clean vectorized load-store.
	// vec3 is the special case due to robustness, but robustness2 will generally have 16 byte alignment here,
	// so it should be fine.
	unsigned addr_shift_log2 = raw_buffer_data_type_to_addr_shift_log2(impl, type);

	RawBufferAccessSplit split = {};
	// If we achieve a successful split, we can vectorize.
	return extract_raw_buffer_access_split(byte_offset, 1, addr_shift_log2, vecsize, split);
}